

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  pointer pbVar1;
  cmState *pcVar2;
  pointer pSVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  cmValue cVar7;
  string *path;
  pointer key;
  pointer pbVar8;
  allocator<char> local_269;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  SaveCacheEntry save;
  cmList argsSplit;
  string local_1c8;
  ostringstream warning;
  
  cmList::cmList(&argsSplit,var,Yes);
  pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&warning,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",(allocator<char> *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&save,"",(allocator<char> *)&saved);
  cmState::SetGlobalProperty(pcVar2,(string *)&warning,&save.key);
  std::__cxx11::string::~string((string *)&save);
  std::__cxx11::string::~string((string *)&warning);
  bVar4 = GetIsInTryCompile(this);
  iVar5 = 0;
  if (!bVar4) {
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&warning);
    std::operator<<((ostream *)&warning,
                    "You have changed variables that require your cache to be deleted.\nConfigure will be re-run and you may have to reset some variables.\nThe following variables have changed:\n"
                   );
    for (pbVar8 = argsSplit.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 != argsSplit.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
      save.key._M_dataplus._M_p = (pointer)&save.key.field_2;
      save.key._M_string_length = 0;
      save.key.field_2._M_local_buf[0] = '\0';
      save.value._M_dataplus._M_p = (pointer)&save.value.field_2;
      save.value._M_string_length = 0;
      save.value.field_2._M_local_buf[0] = '\0';
      save.help._M_dataplus._M_p = (pointer)&save.help.field_2;
      save.help._M_string_length = 0;
      save.help.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&save);
      poVar6 = std::operator<<((ostream *)&warning,(string *)pbVar8);
      std::operator<<(poVar6,"= ");
      pbVar1 = pbVar8 + 1;
      if (pbVar1 == argsSplit.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<((ostream *)&warning,'\n');
      }
      else {
        std::__cxx11::string::_M_assign((string *)&save.value);
        poVar6 = std::operator<<((ostream *)&warning,(string *)pbVar1);
        std::operator<<(poVar6,'\n');
        pbVar8 = pbVar1;
      }
      cVar7 = cmState::GetCacheEntryValue
                        ((this->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&save.key);
      if (cVar7.Value == (string *)0x0) {
        save.type = UNINITIALIZED;
      }
      else {
        save.type = cmState::GetCacheEntryType
                              ((this->State)._M_t.
                               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&save.key);
        pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"HELPSTRING",&local_269);
        cVar7 = cmState::GetCacheEntryProperty(pcVar2,&save.key,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (cVar7.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&save.help);
        }
      }
      std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::emplace_back<SaveCacheEntry>
                (&saved,&save);
      SaveCacheEntry::~SaveCacheEntry(&save);
    }
    path = GetHomeOutputDirectory_abi_cxx11_(this);
    DeleteCache(this,path);
    LoadCache(this);
    pSVar3 = saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (key = saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
               super__Vector_impl_data._M_start; key != pSVar3; key = key + 1) {
      AddCacheEntry(this,&key->key,(cmValue)&key->value,(cmValue)&key->help,key->type);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&save.key,(char *)0x0);
    std::__cxx11::string::~string((string *)&save);
    bVar4 = cmSystemTools::GetErrorOccurredFlag();
    iVar5 = 0;
    if (!bVar4) {
      iVar5 = Configure(this);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&warning);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&saved);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argsSplit.Values);
  return iVar5;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  cmList argsSplit{ var, cmList::EmptyElements::Yes };
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  warning
    << "You have changed variables that require your cache to be deleted.\n"
       "Configure will be re-run and you may have to reset some variables.\n"
       "The following variables have changed:\n";
  for (auto i = argsSplit.begin(); i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    if (i != argsSplit.end()) {
      save.value = *i;
      warning << *i << '\n';
    } else {
      warning << '\n';
      i -= 1;
    }
    cmValue existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (cmValue help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = *help;
      }
    } else {
      save.type = cmStateEnums::CacheEntryType::UNINITIALIZED;
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value, i.help, i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccurredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}